

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::torrent::on_storage_moved
          (torrent *this,status_t status,string *path,storage_error *error)

{
  _Atomic_word *p_Var1;
  byte bVar2;
  _func_int *p_Var3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined1 local_50 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  this->field_0x600 = this->field_0x600 & 0xdf;
  p_Var3 = (((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[5]
  ;
  if ((status.m_val & 5) == 0) {
    iVar4 = (*p_Var3)();
    if ((*(uint *)(CONCAT44(extraout_var_01,iVar4) + 0x68) & 8) != 0) {
      iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)local_50);
      alert_manager::
      emplace_alert<libtorrent::storage_moved_alert,libtorrent::torrent_handle,std::__cxx11::string_const&,std::__cxx11::string&>
                ((alert_manager *)CONCAT44(extraout_var_02,iVar4),(torrent_handle *)local_50,path,
                 &this->m_save_path);
      if ((piece_picker *)local_50._8_8_ != (piece_picker *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = (_Atomic_word *)(local_50._8_8_ + 0xc);
          iVar4 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar4 = *(_Atomic_word *)(local_50._8_8_ + 0xc);
          *(int *)(local_50._8_8_ + 0xc) = iVar4 + -1;
        }
        if (iVar4 == 1) {
          (*(*(_func_int ***)local_50._8_8_)[3])();
        }
      }
    }
    ::std::__cxx11::string::_M_assign((string *)&this->m_save_path);
    bVar2 = (this->m_need_save_resume_data).m_val;
    if ((bVar2 & 0x20) == 0) {
      (this->m_need_save_resume_data).m_val = bVar2 | 0x20;
      state_updated(this);
    }
    if ((status.m_val & 2) != 0) {
      force_recheck(this);
    }
  }
  else {
    iVar4 = (*p_Var3)();
    if ((*(uint *)(CONCAT44(extraout_var,iVar4) + 0x68) & 8) != 0) {
      iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)local_50);
      resolve_filename_abi_cxx11_
                ((string *)(local_50 + 0x10),this,(file_index_t)(int)*(int3 *)&error->field_0x10);
      alert_manager::
      emplace_alert<libtorrent::storage_moved_failed_alert,libtorrent::torrent_handle,boost::system::error_code_const&,std::__cxx11::string,libtorrent::operation_t_const&>
                ((alert_manager *)CONCAT44(extraout_var_00,iVar4),(torrent_handle *)local_50,
                 &error->ec,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_50 + 0x10),&error->operation);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._16_8_ != &local_30) {
        operator_delete((void *)local_50._16_8_,(ulong)(local_30._M_allocated_capacity + 1));
      }
      if ((tuple<libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
           )local_50._8_8_ != (_Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = (_Atomic_word *)(local_50._8_8_ + 0xc);
          iVar4 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar4 = *(_Atomic_word *)(local_50._8_8_ + 0xc);
          *(int *)(local_50._8_8_ + 0xc) = iVar4 + -1;
        }
        if (iVar4 == 1) {
          (*(code *)(((vector<piece_pos,_piece_index_t> *)local_50._8_8_)->
                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ).
                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ._M_impl.super__Vector_impl_data._M_start[3])();
        }
      }
    }
  }
  return;
}

Assistant:

void torrent::on_storage_moved(status_t const status, std::string const& path
		, storage_error const& error) try
	{
		TORRENT_ASSERT(is_single_thread());

		m_moving_storage = false;
		bool const has_error_status
			= (status & disk_status::fatal_disk_error)
			|| (status & disk_status::file_exist);

		if (!has_error_status)
		{
			if (alerts().should_post<storage_moved_alert>())
				alerts().emplace_alert<storage_moved_alert>(get_handle(), path, m_save_path);
			m_save_path = path;
			set_need_save_resume(torrent_handle::if_config_changed);
			if (status & disk_status::need_full_check)
				force_recheck();
		}
		else
		{
			if (alerts().should_post<storage_moved_failed_alert>())
				alerts().emplace_alert<storage_moved_failed_alert>(get_handle(), error.ec
					, resolve_filename(error.file()), error.operation);
		}
	}
	catch (...) { handle_exception(); }